

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O2

void checkRecord<testgen_r::RootRecord,testgen::RootRecord>(RootRecord *r1,RootRecord *r2)

{
  readonly_property<bool> rVar1;
  readonly_property65 rVar2;
  unit_test_log_t *puVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  shared_count *psVar4;
  _Rb_tree_node_base local_470;
  undefined1 local_450 [16];
  shared_count asStack_440 [4];
  undefined1 local_420 [16];
  _Base_ptr local_410;
  _Base_ptr local_408;
  assertion_result local_3f0;
  int32_t *local_3d8;
  _Rb_tree_node_base local_3d0;
  const_string local_3b0;
  const_string local_3a0;
  const_string local_390;
  const_string local_380;
  const_string local_370;
  char *local_360;
  char *local_358;
  const_string local_350;
  const_string local_340;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  const_string local_300;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  const_string local_1b0;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint((unit_test_log_t *)r1,&local_40,0x68,&local_50);
  puVar3 = (unit_test_log_t *)local_420;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (puVar3,&local_60,0x68,1,2,r1,"r1.mylong",r2,"r2.mylong");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_70,0x69,&local_80);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_88 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (puVar3,&local_90,0x69,1,2,&(r1->nestedrecord).inval1,"r1.nestedrecord.inval1",
             &r2->nestedrecord,"r2.nestedrecord.inval1");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_a0,0x6a,&local_b0);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_b8 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (puVar3,&local_c0,0x6a,1,2,&r1->nestedrecord,"r1.nestedrecord.inval2",
             &(r2->nestedrecord).inval2,"r2.nestedrecord.inval2");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_d0,0x6b,&local_e0);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (puVar3,&local_f0,0x6b,1,2,&(r1->nestedrecord).inval3,"r1.nestedrecord.inval3",
             &(r2->nestedrecord).inval3,"r2.nestedrecord.inval3");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_100,0x6c,&local_110);
  rVar1.super_class_property<bool>.value =
       (class_property<bool>)std::operator==(&(r1->mymap)._M_t,&(r2->mymap)._M_t);
  local_450._8_8_ = (element_type *)0x0;
  asStack_440[0].pi_ = (sp_counted_base *)0x0;
  local_408 = &local_470;
  local_470._0_8_ = "r1.mymap == r2.mymap";
  local_470._M_parent = (_Base_ptr)0x1b9a79;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4a50;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_120.m_end = "";
  local_450[0] = rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_420,&local_120,0x6c,CHECK,
             CHECK_PRED,0);
  psVar4 = asStack_440;
  boost::detail::shared_count::~shared_count(psVar4);
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar4,&local_130,0x6d,&local_140);
  local_450[0] = (class_property<bool>)std::operator==(&r1->myarray,&r2->myarray);
  local_450._8_8_ = (element_type *)0x0;
  asStack_440[0].pi_ = (sp_counted_base *)0x0;
  local_470._0_8_ = "r1.myarray == r2.myarray";
  local_470._M_parent = (_Base_ptr)0x1b9a92;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4a50;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = &local_470;
  local_150.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_150.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_420,&local_150,0x6d,CHECK,
             CHECK_PRED,0);
  psVar4 = asStack_440;
  boost::detail::shared_count::~shared_count(psVar4);
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar4,&local_160,0x6e,&local_170);
  puVar3 = (unit_test_log_t *)local_420;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_178 = "";
  local_450._0_8_ = (r1->myunion).idx_;
  local_470._0_8_ = (r2->myunion).idx_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (puVar3,&local_180,0x6e,1,2,local_450,"r1.myunion.idx()",&local_470,"r2.myunion.idx()");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_190,0x6f,&local_1a0);
  testgen_r::_bigrecord_r_Union__2__::get_map_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_420,&r1->myunion);
  testgen::_bigrecord_Union__0__::get_map_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_450,&r2->myunion);
  local_3f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)local_420,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)local_450);
  local_3f0.m_message.px = (element_type *)0x0;
  local_3f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470._M_right = &local_3d0;
  local_3d0._0_8_ = "r1.myunion.get_map() == r2.myunion.get_map()";
  local_3d0._M_parent = (_Base_ptr)0x1b9ae1;
  local_470._M_parent = (_Base_ptr)((ulong)local_470._M_parent & 0xffffffffffffff00);
  local_470._0_8_ = &PTR__lazy_ostream_001e4a50;
  local_470._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_1b0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_3f0,(lazy_ostream *)&local_470,&local_1b0,0x6f,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_3f0.m_message.pn);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_450);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_420;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(this);
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1c0,0x70,&local_1d0);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_1d8 = "";
  local_450._0_8_ = (r1->anotherunion).idx_;
  local_470._0_8_ = (r2->anotherunion).idx_;
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (puVar3,&local_1e0,0x70,1,2,local_450,"r1.anotherunion.idx()",(lazy_ostream *)&local_470
             ,"r2.anotherunion.idx()");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_1f0,0x71,&local_200);
  testgen_r::_bigrecord_r_Union__3__::get_bytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_470,&r1->anotherunion);
  testgen::_bigrecord_Union__1__::get_bytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f0,&r2->anotherunion);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_470,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f0);
  local_450[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_450._8_8_ = (element_type *)0x0;
  asStack_440[0].pi_ = (sp_counted_base *)0x0;
  local_3d0._0_8_ = "r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes()";
  local_3d0._M_parent = (_Base_ptr)0x1b9b48;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4a50;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = &local_3d0;
  local_210.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_210.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_420,&local_210,0x71,CHECK,
             CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(asStack_440);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f0);
  this_00 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_470;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_220,0x72,&local_230);
  puVar3 = (unit_test_log_t *)local_420;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_238 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (puVar3,&local_240,0x72,1,2,&r1->mybool,"r1.mybool",&r2->mybool,"r2.mybool");
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_250,0x73,&local_260);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_268 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (puVar3,&local_270,0x73,1,2,&(r1->anothernested).inval1,"r1.anothernested.inval1",
             &r2->anothernested,"r2.anothernested.inval1");
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_280,0x74,&local_290);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_298 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (puVar3,&local_2a0,0x74,1,2,&r1->anothernested,"r1.anothernested.inval2",
             &(r2->anothernested).inval2,"r2.anothernested.inval2");
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_2b0,0x75,&local_2c0);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_2c8 = "";
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (puVar3,&local_2d0,0x75,1,2,&(r1->anothernested).inval3,"r1.anothernested.inval3",
             &(r2->anothernested).inval3,"r2.anothernested.inval3");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_2e0,0x77,&local_2f0);
  local_3d8 = &r1->anotherint;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_450,(equal_coll_impl *)&local_470,(r1->myfixed).elems,
             (uchar *)local_3d8,(r2->myfixed).elems,(uchar *)&r2->anotherint);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_300.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_300.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_420,&local_300,0x77,CHECK,
             CHECK_EQUAL_COLL,4,"r1.myfixed.begin()","r1.myfixed.end()","r2.myfixed.begin()",
             "r2.myfixed.end()");
  psVar4 = asStack_440;
  boost::detail::shared_count::~shared_count(psVar4);
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar4,&local_310,0x78,&local_320);
  puVar3 = (unit_test_log_t *)local_420;
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_328 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (puVar3,&local_330,0x78,1,2,local_3d8,"r1.anotherint",&r2->anotherint,"r2.anotherint");
  local_340.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_340.m_end = "";
  local_350.m_begin = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_340,0x79,&local_350);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_358 = "";
  local_450._0_8_ =
       (long)(r1->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(r1->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_470._0_8_ =
       (r2->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)(r2->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  puVar3 = (unit_test_log_t *)local_420;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (puVar3,&local_360,0x79,1,2,local_450,"r1.bytes.size()",&local_470,"r2.bytes.size()");
  local_370.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_370.m_end = "";
  local_380.m_begin = "";
  local_380.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_370,0x7b,&local_380);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_450,(equal_coll_impl *)&local_470,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(r1->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(r1->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(r2->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(r2->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_390.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_390.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_420,&local_390,0x7b,CHECK,
             CHECK_EQUAL_COLL,4,"r1.bytes.begin()","r1.bytes.end()","r2.bytes.begin()",
             "r2.bytes.end()");
  psVar4 = asStack_440;
  boost::detail::shared_count::~shared_count(psVar4);
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar4,&local_3a0,0x7c,&local_3b0);
  local_420[8] = false;
  local_420._0_8_ = &PTR__lazy_ostream_001e4698;
  local_410 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_408 = (_Base_ptr)0x1b596c;
  local_3d0._M_left = (_Base_ptr)0x1b6211;
  local_3d0._M_right = (_Base_ptr)0x1b6283;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,testgen_r::ExampleEnum,testgen::ExampleEnum>
            (local_420,&local_3d0._M_left,0x7c,1,2,&r1->myenum,"r1.myenum",&r2->myenum,"r2.myenum");
  return;
}

Assistant:

void checkRecord(const T1& r1, const T2& r2)
{
    BOOST_CHECK_EQUAL(r1.mylong, r2.mylong);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval1, r2.nestedrecord.inval1);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval2, r2.nestedrecord.inval2);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval3, r2.nestedrecord.inval3);
    BOOST_CHECK(r1.mymap == r2.mymap);
    BOOST_CHECK(r1.myarray == r2.myarray);
    BOOST_CHECK_EQUAL(r1.myunion.idx(), r2.myunion.idx());
    BOOST_CHECK(r1.myunion.get_map() == r2.myunion.get_map());
    BOOST_CHECK_EQUAL(r1.anotherunion.idx(), r2.anotherunion.idx());
    BOOST_CHECK(r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes());
    BOOST_CHECK_EQUAL(r1.mybool, r2.mybool);
    BOOST_CHECK_EQUAL(r1.anothernested.inval1, r2.anothernested.inval1);
    BOOST_CHECK_EQUAL(r1.anothernested.inval2, r2.anothernested.inval2);
    BOOST_CHECK_EQUAL(r1.anothernested.inval3, r2.anothernested.inval3);
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.myfixed.begin(), r1.myfixed.end(),
        r2.myfixed.begin(), r2.myfixed.end());
    BOOST_CHECK_EQUAL(r1.anotherint, r2.anotherint);
    BOOST_CHECK_EQUAL(r1.bytes.size(), r2.bytes.size());
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.bytes.begin(), r1.bytes.end(),
        r2.bytes.begin(), r2.bytes.end());
    BOOST_CHECK_EQUAL(r1.myenum, r2.myenum);
}